

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void countFinalize(sqlite3_context *context)

{
  undefined8 *puVar1;
  CountCtx *p;
  sqlite3_context *in_stack_ffffffffffffffd8;
  sqlite3_context *pCtx;
  
  puVar1 = (undefined8 *)sqlite3_aggregate_context(in_stack_ffffffffffffffd8,0);
  if (puVar1 == (undefined8 *)0x0) {
    pCtx = (sqlite3_context *)0x0;
  }
  else {
    pCtx = (sqlite3_context *)*puVar1;
  }
  sqlite3_result_int64(pCtx,(i64)in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void countFinalize(sqlite3_context *context){
  CountCtx *p;
  p = sqlite3_aggregate_context(context, 0);
  sqlite3_result_int64(context, p ? p->n : 0);
}